

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationValue.cpp
# Opt level: O0

string * Corrade::Utility::
         ConfigurationValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::fromString(string *__return_storage_ptr__,string *value,ConfigurationValueFlags param_2)

{
  string *value_local;
  ConfigurationValueFlags param_1_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  return __return_storage_ptr__;
}

Assistant:

std::string ConfigurationValue<std::string>::fromString(const std::string& value, ConfigurationValueFlags) {
    return value;
}